

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

FuncDef * sqlite3FunctionSearch(int h,char *zFunc)

{
  byte bVar1;
  byte bVar2;
  FuncDef *pFVar3;
  long lVar4;
  
  pFVar3 = sqlite3BuiltinFunctions.a[h];
joined_r0x001a1f92:
  if (pFVar3 == (FuncDef *)0x0) {
    return (FuncDef *)0x0;
  }
  lVar4 = 0;
  do {
    bVar1 = pFVar3->zName[lVar4];
    bVar2 = zFunc[lVar4];
    if (bVar1 == bVar2) {
      if ((ulong)bVar1 == 0) break;
    }
    else if (""[bVar1] != ""[bVar2]) break;
    lVar4 = lVar4 + 1;
  } while( true );
  if (bVar1 == bVar2) {
    return pFVar3;
  }
  pFVar3 = (pFVar3->u).pHash;
  goto joined_r0x001a1f92;
}

Assistant:

SQLITE_PRIVATE FuncDef *sqlite3FunctionSearch(
  int h,               /* Hash of the name */
  const char *zFunc    /* Name of function */
){
  FuncDef *p;
  for(p=sqlite3BuiltinFunctions.a[h]; p; p=p->u.pHash){
    assert( p->funcFlags & SQLITE_FUNC_BUILTIN );
    if( sqlite3StrICmp(p->zName, zFunc)==0 ){
      return p;
    }
  }
  return 0;
}